

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

string * __thiscall
booster::locale::calendar::get_time_zone_abi_cxx11_(string *__return_storage_ptr__,calendar *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->tz_);
  return __return_storage_ptr__;
}

Assistant:

std::string calendar::get_time_zone() const
{
    return tz_;
}